

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

float vera::remap(float *_value,float *_inputMin,float *_inputMax,float *_outputMin,
                 float *_outputMax,bool _clamp)

{
  float fVar1;
  double dVar2;
  undefined4 local_40;
  float outVal;
  bool _clamp_local;
  float *_outputMax_local;
  float *_outputMin_local;
  float *_inputMax_local;
  float *_inputMin_local;
  float *_value_local;
  
  dVar2 = std::fabs((double)(ulong)(uint)(*_inputMin - *_inputMax));
  fVar1 = std::numeric_limits<float>::epsilon();
  if (fVar1 <= SUB84(dVar2,0)) {
    local_40 = ((*_value - *_inputMin) / (*_inputMax - *_inputMin)) * (*_outputMax - *_outputMin) +
               *_outputMin;
    if (_clamp) {
      if (*_outputMin <= *_outputMax) {
        if (local_40 < *_outputMax || local_40 == *_outputMax) {
          if (local_40 < *_outputMin) {
            local_40 = *_outputMin;
          }
        }
        else {
          local_40 = *_outputMax;
        }
      }
      else if (*_outputMax <= local_40) {
        if (*_outputMin <= local_40 && local_40 != *_outputMin) {
          local_40 = *_outputMin;
        }
      }
      else {
        local_40 = *_outputMax;
      }
    }
    _value_local._4_4_ = local_40;
  }
  else {
    _value_local._4_4_ = *_outputMin;
  }
  return _value_local._4_4_;
}

Assistant:

inline float remap(const float& _value, const float& _inputMin, const float& _inputMax, const float& _outputMin, const float& _outputMax, bool _clamp) {
    if (fabs(_inputMin - _inputMax) < std::numeric_limits<float>::epsilon()) { return _outputMin; } else {
        float outVal = ((_value - _inputMin) / (_inputMax - _inputMin) * (_outputMax - _outputMin) + _outputMin);

        if (_clamp) {
            if (_outputMax < _outputMin) {
                if (outVal < _outputMax) {
                    outVal = _outputMax;
                } else if (outVal > _outputMin) {
                    outVal = _outputMin;
                }
            } else {
                if (outVal > _outputMax) {
                    outVal = _outputMax;
                } else if (outVal < _outputMin) {
                    outVal = _outputMin;
                }
            }
        }
        return outVal;
    }
}